

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::makesegmentendpointsmap(tetgenmesh *this)

{
  uint uVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  undefined8 uVar4;
  char **ppcVar5;
  arraypool *this_00;
  void *pvVar6;
  char *pcVar7;
  point *ppdVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  if (0 < this->b->verbose) {
    puts("  Creating the segment-endpoints map.");
  }
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 0x10;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  pmVar2 = this->subsegs;
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  uVar15 = 0;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  do {
    pvVar6 = memorypool::traverse(pmVar2);
    if (pvVar6 == (void *)0x0) {
      iVar9 = 0x10;
LAB_0012b46d:
      if (this->b->verbose != 0) {
        printf("  Found %ld segments.\n");
      }
      ppdVar8 = (point *)operator_new__(-(ulong)((uVar15 & 0x7000000000000000) != 0) | uVar15 * 0x10
                                       );
      this->segmentendpointslist = ppdVar8;
      this->totalworkmemory = this->totalworkmemory + uVar15 * 0x10;
      if (0 < (long)uVar15) {
        iVar11 = this_00->log2objectsperblock;
        uVar1 = this_00->objectsperblockmark;
        ppcVar5 = this_00->toparray;
        lVar14 = 0;
        uVar12 = 0;
        do {
          pcVar7 = ppcVar5[(uint)uVar12 >> ((byte)iVar11 & 0x1f)];
          lVar13 = (long)(int)((uVar1 & (uint)uVar12) * iVar9);
          *(undefined8 *)((long)this->segmentendpointslist + lVar14) =
               *(undefined8 *)(pcVar7 + lVar13);
          *(undefined8 *)((long)this->segmentendpointslist + lVar14 + 8) =
               *(undefined8 *)(pcVar7 + lVar13 + 8);
          uVar12 = uVar12 + 1;
          lVar14 = lVar14 + 0x10;
        } while (uVar15 != uVar12);
      }
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
      return;
    }
  } while (*(long *)((long)pvVar6 + 0x18) == 0);
  uVar15 = 0;
  lVar14 = 0x10;
  iVar11 = 0;
  do {
    if (*(ulong *)((long)pvVar6 + (long)(snextpivot[snextpivot[0]] >> 1) * 8) < 8) {
      uVar4 = *(undefined8 *)((long)pvVar6 + (long)sorgpivot[0] * 8);
      lVar13 = *(long *)((long)pvVar6 + (long)sdestpivot[0] * 8);
      *(int *)((long)pvVar6 + (long)this->shmarkindex * 4 + 8) = iVar11;
      iVar9 = snextpivot[0];
      while (pvVar6 = (void *)(*(ulong *)((long)pvVar6 + (long)(iVar9 >> 1) * 8) &
                              0xfffffffffffffff8), pvVar6 != (void *)0x0) {
        *(int *)((long)pvVar6 + (long)this->shmarkindex * 4 + 8) = iVar11;
        bVar16 = *(long *)((long)pvVar6 + (long)sorgpivot[0] * 8) != lVar13;
        lVar13 = *(long *)((long)pvVar6 + (long)sdestpivot[bVar16] * 8);
        iVar9 = snextpivot[bVar16];
      }
      pcVar7 = arraypool::getblock(this_00,(int)uVar15);
      lVar14 = (long)this_00->objectbytes;
      lVar10 = ((long)this_00->objectsperblock - 1U & this_00->objects) * lVar14;
      uVar15 = this_00->objects + 1;
      this_00->objects = uVar15;
      *(undefined8 *)(pcVar7 + lVar10) = uVar4;
      *(long *)(pcVar7 + lVar10 + 8) = lVar13;
      iVar11 = iVar11 + 1;
    }
    iVar9 = (int)lVar14;
    pmVar2 = this->subsegs;
    do {
      pvVar6 = memorypool::traverse(pmVar2);
      if (pvVar6 == (void *)0x0) goto LAB_0012b46d;
    } while (*(long *)((long)pvVar6 + 0x18) == 0);
  } while( true );
}

Assistant:

void tetgenmesh::makesegmentendpointsmap()
{
  arraypool *segptlist;
  face segloop, prevseg, nextseg;
  point eorg, edest, *parypt;
  int segindex = 0, idx = 0;
  int i;

  if (b->verbose > 0) {
    printf("  Creating the segment-endpoints map.\n");
  }

  segptlist = new arraypool(2 * sizeof(point), 10);

  // A segment s may have been split into many subsegments. Operate the one
  //   which contains the origin of s. Then mark the rest of subsegments.
  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  segloop.shver = 0;
  while (segloop.sh != NULL) {
    senext2(segloop, prevseg);
    spivotself(prevseg);
    if (prevseg.sh == NULL) {
      eorg = sorg(segloop);
      edest = sdest(segloop);
      setfacetindex(segloop, segindex);
      senext(segloop, nextseg);
      spivotself(nextseg);
      while (nextseg.sh != NULL) {
        setfacetindex(nextseg, segindex);
        nextseg.shver = 0;
        if (sorg(nextseg) != edest) sesymself(nextseg);
        edest = sdest(nextseg);
        // Go the next connected subsegment at edest.
        senextself(nextseg);
        spivotself(nextseg);
      }
      segptlist->newindex((void **) &parypt);
      parypt[0] = eorg;
      parypt[1] = edest;
      segindex++;
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  if (b->verbose) {
    printf("  Found %ld segments.\n", segptlist->objects);
  }

  segmentendpointslist = new point[segptlist->objects * 2];

  totalworkmemory += (segptlist->objects * 2) * sizeof(point *);

  for (i = 0; i < segptlist->objects; i++) {
    parypt = (point *) fastlookup(segptlist, i);
    segmentendpointslist[idx++] = parypt[0];
    segmentendpointslist[idx++] = parypt[1];
  }

  delete segptlist;
}